

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

shared_ptr<const_notch::core::ABackpropLayer> __thiscall
notch::core::Net::getLayer(Net *this,size_t i)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar3;
  shared_ptr<const_notch::core::ABackpropLayer> sVar4;
  
  lVar1 = *(long *)(i + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(i + 0x10) - lVar1 >> 4)) {
    in_RDX._M_pi = in_RDX._M_pi * 0x10;
    pp_Var2 = *(_func_int ***)((long)&(in_RDX._M_pi)->_vptr__Sp_counted_base + lVar1);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(in_RDX._M_pi)->_M_use_count + lVar1);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        bVar3 = __libc_single_threaded != '\0';
        this->_vptr_Net = pp_Var2;
        (this->layers).
        super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        if (bVar3) goto LAB_00120a41;
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
        this->_vptr_Net = pp_Var2;
        (this->layers).
        super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
LAB_00120a41:
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX;
      goto LAB_00120a49;
    }
  }
  else {
    pp_Var2 = (_func_int **)0x0;
  }
  this->_vptr_Net = pp_Var2;
  (this->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00120a49:
  sVar4.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_notch::core::ABackpropLayer>)
         sVar4.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ABackpropLayer> getLayer(size_t i) const {
       return (i < layers.size()) ? layers[i] : nullptr;
    }